

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

void references::scheme::test_equal_<std::__cxx11::string,char[5]>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               char (*expected_value) [5],char *file,int line)

{
  bool bVar1;
  ostream *poVar2;
  int line_local;
  char *file_local;
  char (*expected_value_local) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  
  g_test_count = g_test_count + 1;
  poVar2 = std::operator<<((ostream *)&std::cerr,'(');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
  poVar2 = std::operator<<(poVar2,") : ");
  poVar2 = std::operator<<(poVar2," expected ");
  poVar2 = std::operator<<(poVar2,*expected_value);
  poVar2 = std::operator<<(poVar2,", got ");
  std::operator<<(poVar2,(string *)value);
  bVar1 = std::operator!=(value,*expected_value);
  if (bVar1) {
    g_fault_count = g_fault_count + 1;
    std::operator<<((ostream *)&std::cerr," - FAIL\n");
  }
  else {
    std::operator<<((ostream *)&std::cerr," - success\n");
  }
  return;
}

Assistant:

void test_equal_(const T1 & value, const T2 & expected_value, const char * file, int line)
{
	++g_test_count;
	std::cerr
		//<< file
		<< '(' << line << ") : "
		<< " expected " << expected_value
		<< ", got " << value;
	if (value != expected_value) {
		++g_fault_count;
		std::cerr << " - FAIL\n";
	} else {
		std::cerr << " - success\n";
	}
}